

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::
DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::doPrintDefinition(DerivedFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                    *this,ostream *os)

{
  long *plVar1;
  Expr<float> *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  pointer pSVar7;
  ulong uVar8;
  long lVar9;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  iVar3 = (*(this->
            super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
            ).super_FuncBase._vptr_FuncBase[10])();
  initialize(this);
  pcVar4 = glu::getDataTypeName(TYPE_FLOAT);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
  (*(this->
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).super_FuncBase._vptr_FuncBase[2])(&local_40,this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"(",1);
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  pcVar4 = glu::getDataTypeName(TYPE_FLOAT);
  if (pcVar4 == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar5 = strlen(pcVar4);
    std::__ostream_insert<char,std::char_traits<char>>(os,pcVar4,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,*(char **)CONCAT44(extraout_var,iVar3),
             ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n{\n",4);
  pSVar7 = (this->m_body).
           super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_body).
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
      ._M_impl.super__Vector_impl_data._M_finish != pSVar7) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      plVar1 = *(long **)((long)&(pSVar7->
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Statement>)
                                 .m_ptr + lVar9);
      (**(code **)(*plVar1 + 0x10))(plVar1,os);
      uVar8 = uVar8 + 1;
      pSVar7 = (this->m_body).
               super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x10;
    } while (uVar8 < (ulong)((long)(this->m_body).
                                   super__Vector_base<deqp::gls::BuiltinPrecisionTests::StatementP,_std::allocator<deqp::gls::BuiltinPrecisionTests::StatementP>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar7 >> 4));
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"return ",7);
  pEVar2 = (this->m_ret).super_ExprPBase<float>.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>.m_ptr;
  (*(pEVar2->super_ExprBase)._vptr_ExprBase[2])(pEVar2,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,";\n",2);
  std::__ostream_insert<char,std::char_traits<char>>(os,"}\n",2);
  return;
}

Assistant:

void						doPrintDefinition	(ostream& os) const
	{
		const ParamNames&	paramNames	= this->getParamNames();

		initialize();

		os << dataTypeNameOf<Ret>() << " " << this->getName()
			<< "(";
		if (isTypeValid<Arg0>())
			os << dataTypeNameOf<Arg0>() << " " << paramNames.a;
		if (isTypeValid<Arg1>())
			os << ", " << dataTypeNameOf<Arg1>() << " " << paramNames.b;
		if (isTypeValid<Arg2>())
			os << ", " << dataTypeNameOf<Arg2>() << " " << paramNames.c;
		if (isTypeValid<Arg3>())
			os << ", " << dataTypeNameOf<Arg3>() << " " << paramNames.d;
		os << ")\n{\n";

		for (size_t ndx = 0; ndx < m_body.size(); ++ndx)
			os << *m_body[ndx];
		os << "return " << *m_ret << ";\n";
		os << "}\n";
	}